

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall
google::protobuf::io::Printer::ValueImpl<true>::ValueImpl<int_const&,void>
          (ValueImpl<true> *this,int *value)

{
  Nonnull<char_*> pcVar1;
  long local_50;
  Nonnull<char_*> local_48;
  char local_40 [32];
  
  pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer(*value,local_40);
  local_50 = (long)pcVar1 - (long)local_40;
  local_48 = local_40;
  ToStringOrCallback_abi_cxx11_(this,this,&local_50);
  (this->consume_after)._M_dataplus._M_p = (pointer)&(this->consume_after).field_2;
  (this->consume_after)._M_string_length = 0;
  (this->consume_after).field_2._M_local_buf[0] = '\0';
  this->consume_parens_if_empty = false;
  if (*(__index_type *)
       ((long)&(this->value).
               super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
               .super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>.
               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
       + 0x20) == '\x01') {
    std::__cxx11::string::_M_replace((ulong)&this->consume_after,0,(char *)0x0,0x522f0c);
  }
  return;
}

Assistant:

ValueImpl(Value&& value)  // NOLINT
      : value(ToStringOrCallback(std::forward<Value>(value), Rank2{})) {
    if (std::holds_alternative<Callback>(this->value)) {
      consume_after = ";,";
    }
  }